

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_SourceCodeUtilities.cpp
# Opt level: O3

CodeLocation __thiscall
soul::SimpleTokeniser::findNext(SimpleTokeniser *this,CodeLocation *start,TokenType target)

{
  TokenType __s1;
  int iVar1;
  char *extraout_RDX;
  char *extraout_RDX_00;
  UTF8Reader UVar2;
  CodeLocation CVar3;
  SimpleTokeniser tokeniser;
  Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
  local_a0;
  
  SimpleTokeniser((SimpleTokeniser *)&local_a0,start,true);
  while (__s1.text = local_a0.currentType.text, local_a0.currentType.text != "$eof") {
    if (local_a0.currentType.text != (char *)0x0) {
      iVar1 = strcmp(local_a0.currentType.text,"$eof");
      if (iVar1 == 0) break;
    }
    if (__s1.text == target.text) {
LAB_001c4857:
      (this->super_SOULTokeniser)._vptr_Tokeniser =
           (_func_int **)local_a0.location.sourceCode.object;
      if (local_a0.location.sourceCode.object != (SourceCodeText *)0x0) {
        ((local_a0.location.sourceCode.object)->super_RefCountedObject).refCount =
             ((local_a0.location.sourceCode.object)->super_RefCountedObject).refCount + 1;
      }
      (this->super_SOULTokeniser).startLocation.sourceCode.object =
           (SourceCodeText *)local_a0.location.location.data;
      Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
      ::~Tokeniser(&local_a0);
      UVar2.data = extraout_RDX_00;
      goto LAB_001c4878;
    }
    if (target.text != (char *)0x0 && __s1.text != (char *)0x0) {
      iVar1 = strcmp(__s1.text,target.text);
      if (iVar1 == 0) goto LAB_001c4857;
    }
    Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
    ::skip(&local_a0);
  }
  Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
  ::~Tokeniser(&local_a0);
  (this->super_SOULTokeniser)._vptr_Tokeniser = (_func_int **)0x0;
  (this->super_SOULTokeniser).startLocation.sourceCode.object = (SourceCodeText *)0x0;
  UVar2.data = extraout_RDX;
LAB_001c4878:
  CVar3.location.data = UVar2.data;
  CVar3.sourceCode.object = (SourceCodeText *)this;
  return CVar3;
}

Assistant:

static CodeLocation findNext (CodeLocation start, TokenType target)
    {
        try
        {
            SimpleTokeniser tokeniser (start, true);

            while (! tokeniser.matches (Token::eof))
            {
                if (tokeniser.matches (target))
                    return tokeniser.location;

                tokeniser.skip();
            }
        }
        catch (const AbortCompilationException&) {}

        return {};
    }